

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

VarnodeTpl * __thiscall OperandSymbol::getVarnode(OperandSymbol *this)

{
  int iVar1;
  long *local_50;
  SpecificSymbol *specsym;
  VarnodeTpl *local_18;
  VarnodeTpl *res;
  OperandSymbol *this_local;
  
  if (this->defexp == (PatternExpression *)0x0) {
    if (this->triple == (TripleSymbol *)0x0) {
      local_50 = (long *)0x0;
    }
    else {
      local_50 = (long *)__dynamic_cast(this->triple,&TripleSymbol::typeinfo,
                                        &SpecificSymbol::typeinfo,0);
    }
    if (local_50 == (long *)0x0) {
      if ((this->triple == (TripleSymbol *)0x0) ||
         ((iVar1 = (*(this->triple->super_SleighSymbol)._vptr_SleighSymbol[2])(), iVar1 != 4 &&
          (iVar1 = (*(this->triple->super_SleighSymbol)._vptr_SleighSymbol[2])(), iVar1 != 5)))) {
        local_18 = (VarnodeTpl *)operator_new(0x68);
        VarnodeTpl::VarnodeTpl(local_18,this->hand,false);
      }
      else {
        local_18 = (VarnodeTpl *)operator_new(0x68);
        VarnodeTpl::VarnodeTpl(local_18,this->hand,true);
      }
    }
    else {
      local_18 = (VarnodeTpl *)(**(code **)(*local_50 + 0x60))();
    }
  }
  else {
    local_18 = (VarnodeTpl *)operator_new(0x68);
    VarnodeTpl::VarnodeTpl(local_18,this->hand,true);
  }
  return local_18;
}

Assistant:

VarnodeTpl *OperandSymbol::getVarnode(void) const

{
  VarnodeTpl *res;
  if (defexp != (PatternExpression *)0)
    res = new VarnodeTpl(hand,true); // Definite constant handle
  else {
    SpecificSymbol *specsym = dynamic_cast<SpecificSymbol *>(triple);
    if (specsym != (SpecificSymbol *)0)
      res = specsym->getVarnode();
    else if ((triple != (TripleSymbol *)0)&&
	     ((triple->getType() == valuemap_symbol)||(triple->getType() == name_symbol)))
      res = new VarnodeTpl(hand,true); // Zero-size symbols
    else
      res = new VarnodeTpl(hand,false); // Possible dynamic handle
  }
  return res;
}